

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::RoundFun::GetFunctions(void)

{
  LogicalTypeId LVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  bool bVar2;
  vector<duckdb::ScalarFunction,_true> *this;
  InternalException *this_00;
  long lVar3;
  code *pcVar4;
  ScalarFunctionSet *in_RDI;
  code *pcVar5;
  LogicalType *pLVar6;
  LogicalType *this_01;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  scalar_function_t round_func;
  scalar_function_t round_prec_func;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbdc;
  FunctionNullHandling in_stack_fffffffffffffbe8;
  allocator_type local_411;
  _Any_data local_3f8;
  code *local_3e8;
  undefined8 uStack_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  undefined8 uStack_3c0;
  _Any_data *local_3b0;
  _Any_data *local_3a8;
  LogicalType *local_3a0;
  undefined1 local_398 [48];
  LogicalType *local_368;
  LogicalType *local_360;
  _Any_data local_350;
  code *local_340;
  _Any_data local_330;
  code *local_320;
  LogicalType local_310;
  vector<duckdb::LogicalType,_true> local_2f8;
  LogicalType local_2e0;
  vector<duckdb::LogicalType,_true> local_2c8;
  LogicalType local_2b0;
  LogicalType local_298;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::Numeric();
  if (local_368 != local_360) {
    this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
    local_3a8 = (_Any_data *)&local_158.function;
    local_3b0 = (_Any_data *)&local_280.function;
    local_3a0 = local_360;
    pLVar6 = local_360;
    this_01 = local_368;
    do {
      local_3c8 = (code *)0x0;
      uStack_3c0 = 0;
      local_3d8._M_unused._M_object = (void *)0x0;
      local_3d8._8_8_ = 0;
      local_3e8 = (code *)0x0;
      uStack_3e0 = 0;
      local_3f8._M_unused._M_object = (void *)0x0;
      local_3f8._8_8_ = 0;
      bVar2 = LogicalType::IsIntegral(this_01);
      if (!bVar2) {
        LVar1 = this_01->id_;
        pcVar5 = BindDecimalRoundPrecision;
        pcVar4 = BindGenericRoundFunctionDecimal<duckdb::RoundDecimalOperator>;
        if (LVar1 != DECIMAL) {
          pcVar5 = ScalarFunction::UnaryFunction<float,float,duckdb::RoundOperator>;
          pcVar4 = ScalarFunction::BinaryFunction<float,int,float,duckdb::RoundOperatorPrecision>;
          if (LVar1 != FLOAT) {
            if (LVar1 != DOUBLE) {
              this_00 = (InternalException *)__cxa_allocate_exception(0x10);
              local_398._0_8_ = local_398 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_398,"Unimplemented numeric type for function \"floor\"","")
              ;
              InternalException::InternalException(this_00,(string *)local_398);
              __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            pcVar5 = ScalarFunction::UnaryFunction<double,double,duckdb::RoundOperator>;
            pcVar4 = ScalarFunction::
                     BinaryFunction<double,int,double,duckdb::RoundOperatorPrecision>;
          }
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    local_3f8._M_pod_data,pcVar5);
          ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    local_3d8._M_pod_data,pcVar4);
          pcVar5 = (bind_scalar_function_t)0x0;
          pcVar4 = (bind_scalar_function_t)0x0;
        }
        LogicalType::LogicalType((LogicalType *)local_398,this_01);
        __l._M_len = 1;
        __l._M_array = (LogicalType *)local_398;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2c8,
                   __l,&local_411);
        LogicalType::LogicalType(&local_2e0,this_01);
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_330,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_3f8);
        LogicalType::LogicalType(&local_298,INVALID);
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs._0_8_ = &local_298;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffbd4;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffbdc;
        ScalarFunction::ScalarFunction
                  (&local_158,&local_2c8,&local_2e0,(scalar_function_t *)&local_330,pcVar4,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffbe8,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&this->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_158);
        local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_02432a00;
        if (local_158.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_158.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_158.function.super__Function_base._M_manager)
                    (local_3a8,local_3a8,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_298);
        if (local_320 != (code *)0x0) {
          (*local_320)(&local_330,&local_330,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_2e0);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2c8);
        LogicalType::~LogicalType((LogicalType *)local_398);
        LogicalType::LogicalType((LogicalType *)local_398,this_01);
        LogicalType::LogicalType((LogicalType *)(local_398 + 0x18),INTEGER);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_398;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2f8,
                   __l_00,&local_411);
        LogicalType::LogicalType(&local_310,this_01);
        ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_350,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_3d8);
        LogicalType::LogicalType(&local_2b0,INVALID);
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
        varargs_00._0_8_ = &local_2b0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
             in_stack_fffffffffffffbd4;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
        varargs_00.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = in_stack_fffffffffffffbdc;
        ScalarFunction::ScalarFunction
                  (&local_280,&local_2f8,&local_310,(scalar_function_t *)&local_350,pcVar5,
                   (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                   (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffffbe8,
                   (bind_lambda_function_t)in_RDI);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  (&this->
                    super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                   &local_280);
        local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             (_func_int **)&PTR__ScalarFunction_02432a00;
        if (local_280.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_280.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_280.function.super__Function_base._M_manager)
                    (local_3b0,local_3b0,__destroy_functor);
        }
        BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
        LogicalType::~LogicalType(&local_2b0);
        if (local_340 != (code *)0x0) {
          (*local_340)(&local_350,&local_350,__destroy_functor);
        }
        LogicalType::~LogicalType(&local_310);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2f8);
        lVar3 = 0x18;
        do {
          LogicalType::~LogicalType((LogicalType *)(local_398 + lVar3));
          lVar3 = lVar3 + -0x18;
          pLVar6 = local_3a0;
        } while (lVar3 != -0x18);
      }
      if (local_3e8 != (code *)0x0) {
        (*local_3e8)(&local_3f8,&local_3f8,__destroy_functor);
      }
      if (local_3c8 != (code *)0x0) {
        (*local_3c8)(&local_3d8,&local_3d8,__destroy_functor);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pLVar6);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_368);
  return in_RDI;
}

Assistant:

ScalarFunctionSet RoundFun::GetFunctions() {
	ScalarFunctionSet round;
	for (auto &type : LogicalType::Numeric()) {
		scalar_function_t round_prec_func = nullptr;
		scalar_function_t round_func = nullptr;
		bind_scalar_function_t bind_func = nullptr;
		bind_scalar_function_t bind_prec_func = nullptr;
		if (type.IsIntegral()) {
			// no round for integral numbers
			continue;
		}
		switch (type.id()) {
		case LogicalTypeId::FLOAT:
			round_func = ScalarFunction::UnaryFunction<float, float, RoundOperator>;
			round_prec_func = ScalarFunction::BinaryFunction<float, int32_t, float, RoundOperatorPrecision>;
			break;
		case LogicalTypeId::DOUBLE:
			round_func = ScalarFunction::UnaryFunction<double, double, RoundOperator>;
			round_prec_func = ScalarFunction::BinaryFunction<double, int32_t, double, RoundOperatorPrecision>;
			break;
		case LogicalTypeId::DECIMAL:
			bind_func = BindGenericRoundFunctionDecimal<RoundDecimalOperator>;
			bind_prec_func = BindDecimalRoundPrecision;
			break;
		default:
			throw InternalException("Unimplemented numeric type for function \"floor\"");
		}
		round.AddFunction(ScalarFunction({type}, type, round_func, bind_func));
		round.AddFunction(ScalarFunction({type, LogicalType::INTEGER}, type, round_prec_func, bind_prec_func));
	}
	return round;
}